

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_v_predictor_64x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  ushort uVar29;
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  unkuint9 Var33;
  undefined1 auVar34 [11];
  undefined1 auVar35 [13];
  undefined1 auVar36 [15];
  unkuint9 Var37;
  undefined1 auVar38 [11];
  undefined1 auVar39 [15];
  unkuint9 Var40;
  undefined1 auVar41 [11];
  undefined1 auVar42 [13];
  undefined1 auVar43 [15];
  unkuint9 Var44;
  undefined1 auVar45 [11];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  uint uVar54;
  uint8_t *puVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  short sVar58;
  ushort uVar59;
  short sVar60;
  short sVar61;
  ushort uVar62;
  short sVar63;
  short sVar64;
  short sVar66;
  undefined1 auVar65 [16];
  short sVar67;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  undefined1 auVar68 [16];
  short sVar81;
  undefined1 auVar69 [16];
  short sVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  short sVar95;
  ushort uVar96;
  ushort uVar97;
  short sVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  
  auVar57 = _DAT_00513aa0;
  auVar56 = pshuflw(ZEXT116(left_column[0xf]),ZEXT116(left_column[0xf]),0);
  auVar1 = *(undefined1 (*) [16])top_row;
  auVar2 = *(undefined1 (*) [16])(top_row + 0x10);
  auVar3 = *(undefined1 (*) [16])(top_row + 0x20);
  auVar4 = *(undefined1 (*) [16])(top_row + 0x30);
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar1._0_13_;
  auVar8[0xe] = auVar1[7];
  auVar12[0xc] = auVar1[6];
  auVar12._0_12_ = auVar1._0_12_;
  auVar12._13_2_ = auVar8._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = auVar1._0_11_;
  auVar16._12_3_ = auVar12._12_3_;
  auVar20[10] = auVar1[5];
  auVar20._0_10_ = auVar1._0_10_;
  auVar20._11_4_ = auVar16._11_4_;
  auVar24[9] = 0;
  auVar24._0_9_ = auVar1._0_9_;
  auVar24._10_5_ = auVar20._10_5_;
  auVar28[8] = auVar1[4];
  auVar28._0_8_ = auVar1._0_8_;
  auVar28._9_6_ = auVar24._9_6_;
  auVar32._7_8_ = 0;
  auVar32._0_7_ = auVar28._8_7_;
  Var33 = CONCAT81(SUB158(auVar32 << 0x40,7),auVar1[3]);
  auVar46._9_6_ = 0;
  auVar46._0_9_ = Var33;
  auVar34._1_10_ = SUB1510(auVar46 << 0x30,5);
  auVar34[0] = auVar1[2];
  auVar47._11_4_ = 0;
  auVar47._0_11_ = auVar34;
  auVar35._1_12_ = SUB1512(auVar47 << 0x20,3);
  auVar35[0] = auVar1[1];
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar2._0_13_;
  auVar5[0xe] = auVar2[7];
  auVar9[0xc] = auVar2[6];
  auVar9._0_12_ = auVar2._0_12_;
  auVar9._13_2_ = auVar5._13_2_;
  auVar13[0xb] = 0;
  auVar13._0_11_ = auVar2._0_11_;
  auVar13._12_3_ = auVar9._12_3_;
  auVar17[10] = auVar2[5];
  auVar17._0_10_ = auVar2._0_10_;
  auVar17._11_4_ = auVar13._11_4_;
  auVar21[9] = 0;
  auVar21._0_9_ = auVar2._0_9_;
  auVar21._10_5_ = auVar17._10_5_;
  auVar25[8] = auVar2[4];
  auVar25._0_8_ = auVar2._0_8_;
  auVar25._9_6_ = auVar21._9_6_;
  auVar36._7_8_ = 0;
  auVar36._0_7_ = auVar25._8_7_;
  Var37 = CONCAT81(SUB158(auVar36 << 0x40,7),auVar2[3]);
  auVar48._9_6_ = 0;
  auVar48._0_9_ = Var37;
  auVar38._1_10_ = SUB1510(auVar48 << 0x30,5);
  auVar38[0] = auVar2[2];
  auVar49._11_4_ = 0;
  auVar49._0_11_ = auVar38;
  auVar30[2] = auVar2[1];
  auVar30._0_2_ = auVar2._0_2_;
  auVar30._3_12_ = SUB1512(auVar49 << 0x20,3);
  uVar59 = auVar2._0_2_ & 0xff;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar3._0_13_;
  auVar6[0xe] = auVar3[7];
  auVar10[0xc] = auVar3[6];
  auVar10._0_12_ = auVar3._0_12_;
  auVar10._13_2_ = auVar6._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = auVar3._0_11_;
  auVar14._12_3_ = auVar10._12_3_;
  auVar18[10] = auVar3[5];
  auVar18._0_10_ = auVar3._0_10_;
  auVar18._11_4_ = auVar14._11_4_;
  auVar22[9] = 0;
  auVar22._0_9_ = auVar3._0_9_;
  auVar22._10_5_ = auVar18._10_5_;
  auVar26[8] = auVar3[4];
  auVar26._0_8_ = auVar3._0_8_;
  auVar26._9_6_ = auVar22._9_6_;
  auVar39._7_8_ = 0;
  auVar39._0_7_ = auVar26._8_7_;
  Var40 = CONCAT81(SUB158(auVar39 << 0x40,7),auVar3[3]);
  auVar50._9_6_ = 0;
  auVar50._0_9_ = Var40;
  auVar41._1_10_ = SUB1510(auVar50 << 0x30,5);
  auVar41[0] = auVar3[2];
  auVar51._11_4_ = 0;
  auVar51._0_11_ = auVar41;
  auVar42._1_12_ = SUB1512(auVar51 << 0x20,3);
  auVar42[0] = auVar3[1];
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar4._0_13_;
  auVar7[0xe] = auVar4[7];
  auVar11[0xc] = auVar4[6];
  auVar11._0_12_ = auVar4._0_12_;
  auVar11._13_2_ = auVar7._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar4._0_11_;
  auVar15._12_3_ = auVar11._12_3_;
  auVar19[10] = auVar4[5];
  auVar19._0_10_ = auVar4._0_10_;
  auVar19._11_4_ = auVar15._11_4_;
  auVar23[9] = 0;
  auVar23._0_9_ = auVar4._0_9_;
  auVar23._10_5_ = auVar19._10_5_;
  auVar27[8] = auVar4[4];
  auVar27._0_8_ = auVar4._0_8_;
  auVar27._9_6_ = auVar23._9_6_;
  auVar43._7_8_ = 0;
  auVar43._0_7_ = auVar27._8_7_;
  Var44 = CONCAT81(SUB158(auVar43 << 0x40,7),auVar4[3]);
  auVar52._9_6_ = 0;
  auVar52._0_9_ = Var44;
  auVar45._1_10_ = SUB1510(auVar52 << 0x30,5);
  auVar45[0] = auVar4[2];
  auVar53._11_4_ = 0;
  auVar53._0_11_ = auVar45;
  auVar31[2] = auVar4[1];
  auVar31._0_2_ = auVar4._0_2_;
  auVar31._3_12_ = SUB1512(auVar53 << 0x20,3);
  uVar62 = auVar4._0_2_ & 0xff;
  sVar64 = auVar56._0_2_;
  sVar66 = auVar56._2_2_;
  auVar56._2_2_ = sVar66 * 0x1f;
  auVar56._0_2_ = sVar64;
  auVar56._4_2_ = sVar64 * 0x3c;
  auVar56._6_2_ = sVar66 * 0x56;
  auVar56._8_2_ = sVar64 * 0x6f;
  auVar56._10_2_ = sVar66 * 0x85;
  auVar56._12_2_ = sVar64 * 0x9a;
  auVar56._14_2_ = sVar66 * 0xac;
  puVar55 = dst + 0x30;
  uVar54 = 0xfefdfefe;
  do {
    uVar54 = uVar54 + 0x2020202;
    auVar68._4_4_ = uVar54;
    auVar68._0_4_ = uVar54;
    auVar68._8_4_ = uVar54;
    auVar68._12_4_ = uVar54;
    auVar65 = pshufb(auVar57,auVar68);
    auVar68 = pshufb(auVar56,auVar68);
    sVar72 = auVar65._0_2_;
    sVar74 = auVar65._2_2_;
    sVar76 = auVar65._4_2_;
    sVar58 = (short)Var33;
    sVar78 = auVar65._6_2_;
    sVar80 = auVar65._8_2_;
    sVar82 = auVar65._10_2_;
    sVar95 = auVar65._12_2_;
    sVar98 = auVar65._14_2_;
    uVar29 = auVar8._13_2_ >> 8;
    sVar67 = auVar68._0_2_ + 0x80;
    sVar70 = auVar68._2_2_ + 0x80;
    sVar71 = auVar68._4_2_ + 0x80;
    sVar73 = auVar68._6_2_ + 0x80;
    sVar75 = auVar68._8_2_ + 0x80;
    sVar77 = auVar68._10_2_ + 0x80;
    sVar79 = auVar68._12_2_ + 0x80;
    sVar81 = auVar68._14_2_ + 0x80;
    uVar83 = sVar72 * (ushort)auVar1[0] + sVar67;
    uVar85 = sVar74 * auVar35._0_2_ + sVar70;
    uVar87 = sVar76 * auVar34._0_2_ + sVar71;
    uVar89 = sVar78 * sVar58 + sVar73;
    uVar91 = sVar80 * auVar28._8_2_ + sVar75;
    uVar93 = sVar82 * auVar20._10_2_ + sVar77;
    uVar96 = sVar95 * auVar12._12_2_ + sVar79;
    uVar99 = sVar98 * uVar29 + sVar81;
    uVar84 = uVar83 >> 8;
    uVar86 = uVar85 >> 8;
    uVar88 = uVar87 >> 8;
    uVar90 = uVar89 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar97 = uVar96 >> 8;
    uVar100 = uVar99 >> 8;
    uVar102 = sVar72 * (ushort)auVar1[8] + sVar67;
    uVar104 = sVar74 * (ushort)auVar1[9] + sVar70;
    uVar106 = sVar76 * (ushort)auVar1[10] + sVar71;
    uVar108 = sVar78 * (ushort)auVar1[0xb] + sVar73;
    uVar110 = sVar80 * (ushort)auVar1[0xc] + sVar75;
    uVar112 = sVar82 * (ushort)auVar1[0xd] + sVar77;
    uVar114 = sVar95 * (ushort)auVar1[0xe] + sVar79;
    uVar116 = sVar98 * (ushort)auVar1[0xf] + sVar81;
    uVar103 = uVar102 >> 8;
    uVar105 = uVar104 >> 8;
    uVar107 = uVar106 >> 8;
    uVar109 = uVar108 >> 8;
    uVar111 = uVar110 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    puVar55[-0x30] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar55[-0x2f] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar55[-0x2e] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar55[-0x2d] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    puVar55[-0x2c] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar55[-0x2b] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar55[-0x2a] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar55[-0x29] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar55[-0x28] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar55[-0x27] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar105);
    puVar55[-0x26] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar55[-0x25] = (uVar109 != 0) * (uVar109 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar109);
    puVar55[-0x24] = (uVar111 != 0) * (uVar111 < 0x100) * (char)(uVar110 >> 8) - (0xff < uVar111);
    puVar55[-0x23] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar55[-0x22] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar55[-0x21] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    sVar60 = (short)Var37;
    uVar83 = auVar5._13_2_ >> 8;
    uVar84 = sVar72 * uVar59 + sVar67;
    uVar86 = sVar74 * auVar30._2_2_ + sVar70;
    uVar88 = sVar76 * auVar38._0_2_ + sVar71;
    uVar90 = sVar78 * sVar60 + sVar73;
    uVar92 = sVar80 * auVar25._8_2_ + sVar75;
    uVar94 = sVar82 * auVar17._10_2_ + sVar77;
    uVar97 = sVar95 * auVar9._12_2_ + sVar79;
    uVar100 = sVar98 * uVar83 + sVar81;
    uVar85 = uVar84 >> 8;
    uVar87 = uVar86 >> 8;
    uVar89 = uVar88 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar96 = uVar94 >> 8;
    uVar99 = uVar97 >> 8;
    uVar102 = uVar100 >> 8;
    uVar103 = sVar72 * (ushort)auVar2[8] + sVar67;
    uVar105 = sVar74 * (ushort)auVar2[9] + sVar70;
    uVar107 = sVar76 * (ushort)auVar2[10] + sVar71;
    uVar109 = sVar78 * (ushort)auVar2[0xb] + sVar73;
    uVar111 = sVar80 * (ushort)auVar2[0xc] + sVar75;
    uVar113 = sVar82 * (ushort)auVar2[0xd] + sVar77;
    uVar115 = sVar95 * (ushort)auVar2[0xe] + sVar79;
    uVar117 = sVar98 * (ushort)auVar2[0xf] + sVar81;
    uVar104 = uVar103 >> 8;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    puVar55[-0x20] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar55[-0x1f] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    puVar55[-0x1e] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    puVar55[-0x1d] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar55[-0x1c] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar55[-0x1b] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar96);
    puVar55[-0x1a] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar99);
    puVar55[-0x19] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar102);
    puVar55[-0x18] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar55[-0x17] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar55[-0x16] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar55[-0x15] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar55[-0x14] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar55[-0x13] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar55[-0x12] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar55[-0x11] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    sVar61 = (short)Var40;
    uVar84 = auVar6._13_2_ >> 8;
    uVar85 = sVar72 * (ushort)auVar3[0] + sVar67;
    uVar87 = sVar74 * auVar42._0_2_ + sVar70;
    uVar89 = sVar76 * auVar41._0_2_ + sVar71;
    uVar91 = sVar78 * sVar61 + sVar73;
    uVar93 = sVar80 * auVar26._8_2_ + sVar75;
    uVar96 = sVar82 * auVar18._10_2_ + sVar77;
    uVar99 = sVar95 * auVar10._12_2_ + sVar79;
    uVar102 = sVar98 * uVar84 + sVar81;
    uVar86 = uVar85 >> 8;
    uVar88 = uVar87 >> 8;
    uVar90 = uVar89 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar97 = uVar96 >> 8;
    uVar100 = uVar99 >> 8;
    uVar103 = uVar102 >> 8;
    uVar104 = sVar72 * (ushort)auVar3[8] + sVar67;
    uVar106 = sVar74 * (ushort)auVar3[9] + sVar70;
    uVar108 = sVar76 * (ushort)auVar3[10] + sVar71;
    uVar110 = sVar78 * (ushort)auVar3[0xb] + sVar73;
    uVar112 = sVar80 * (ushort)auVar3[0xc] + sVar75;
    uVar114 = sVar82 * (ushort)auVar3[0xd] + sVar77;
    uVar116 = sVar95 * (ushort)auVar3[0xe] + sVar79;
    uVar118 = sVar98 * (ushort)auVar3[0xf] + sVar81;
    uVar105 = uVar104 >> 8;
    uVar107 = uVar106 >> 8;
    uVar109 = uVar108 >> 8;
    uVar111 = uVar110 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    puVar55[-0x10] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar55[-0xf] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar55[-0xe] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    puVar55[-0xd] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar55[-0xc] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar55[-0xb] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar55[-10] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar55[-9] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar55[-8] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar105);
    puVar55[-7] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar55[-6] = (uVar109 != 0) * (uVar109 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar109);
    puVar55[-5] = (uVar111 != 0) * (uVar111 < 0x100) * (char)(uVar110 >> 8) - (0xff < uVar111);
    puVar55[-4] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar55[-3] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar55[-2] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar55[-1] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    sVar63 = (short)Var44;
    uVar85 = auVar7._13_2_ >> 8;
    uVar105 = sVar72 * uVar62 + sVar67;
    uVar107 = sVar74 * auVar31._2_2_ + sVar70;
    uVar109 = sVar76 * auVar45._0_2_ + sVar71;
    uVar111 = sVar78 * sVar63 + sVar73;
    uVar113 = sVar80 * auVar27._8_2_ + sVar75;
    uVar115 = sVar82 * auVar19._10_2_ + sVar77;
    uVar117 = sVar95 * auVar11._12_2_ + sVar79;
    uVar119 = sVar98 * uVar85 + sVar81;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar101 = uVar119 >> 8;
    uVar86 = sVar72 * (ushort)auVar4[8] + sVar67;
    uVar88 = sVar74 * (ushort)auVar4[9] + sVar70;
    uVar90 = sVar76 * (ushort)auVar4[10] + sVar71;
    uVar92 = sVar78 * (ushort)auVar4[0xb] + sVar73;
    uVar94 = sVar80 * (ushort)auVar4[0xc] + sVar75;
    uVar97 = sVar82 * (ushort)auVar4[0xd] + sVar77;
    uVar100 = sVar95 * (ushort)auVar4[0xe] + sVar79;
    uVar103 = sVar98 * (ushort)auVar4[0xf] + sVar81;
    uVar87 = uVar86 >> 8;
    uVar89 = uVar88 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar96 = uVar94 >> 8;
    uVar99 = uVar97 >> 8;
    uVar102 = uVar100 >> 8;
    uVar104 = uVar103 >> 8;
    *puVar55 = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar55[1] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar55[2] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar55[3] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar55[4] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar55[5] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar55[6] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar55[7] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar101);
    puVar55[8] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    puVar55[9] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    puVar55[10] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar55[0xb] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar55[0xc] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar96);
    puVar55[0xd] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar99);
    puVar55[0xe] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar102);
    puVar55[0xf] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    auVar65 = _DAT_00513ad0;
    puVar55 = puVar55 + stride;
  } while (uVar54 < 0xd0c0d0d);
  auVar57._0_2_ = sVar64 * 0xbc;
  auVar57._2_2_ = sVar66 * 0xca;
  auVar57._4_2_ = sVar64 * 0xd5;
  auVar57._6_2_ = sVar66 * 0xdf;
  auVar57._8_2_ = sVar64 * 0xe6;
  auVar57._10_2_ = sVar66 * 0xec;
  auVar57._12_2_ = sVar64 * 0xef;
  auVar57._14_2_ = sVar66 * 0xf0;
  uVar54 = 0xfefdfefe;
  do {
    uVar54 = uVar54 + 0x2020202;
    auVar69._4_4_ = uVar54;
    auVar69._0_4_ = uVar54;
    auVar69._8_4_ = uVar54;
    auVar69._12_4_ = uVar54;
    auVar56 = pshufb(auVar65,auVar69);
    auVar68 = pshufb(auVar57,auVar69);
    sVar79 = auVar56._0_2_;
    sVar81 = auVar56._2_2_;
    sVar72 = auVar56._4_2_;
    sVar74 = auVar56._6_2_;
    sVar76 = auVar56._8_2_;
    sVar78 = auVar56._10_2_;
    sVar80 = auVar56._12_2_;
    sVar82 = auVar56._14_2_;
    sVar64 = auVar68._0_2_ + 0x80;
    sVar66 = auVar68._2_2_ + 0x80;
    sVar67 = auVar68._4_2_ + 0x80;
    sVar70 = auVar68._6_2_ + 0x80;
    sVar71 = auVar68._8_2_ + 0x80;
    sVar73 = auVar68._10_2_ + 0x80;
    sVar75 = auVar68._12_2_ + 0x80;
    sVar77 = auVar68._14_2_ + 0x80;
    uVar86 = sVar79 * (ushort)auVar1[0] + sVar64;
    uVar88 = sVar81 * auVar35._0_2_ + sVar66;
    uVar90 = sVar72 * auVar34._0_2_ + sVar67;
    uVar92 = sVar74 * sVar58 + sVar70;
    uVar94 = sVar76 * auVar28._8_2_ + sVar71;
    uVar97 = sVar78 * auVar20._10_2_ + sVar73;
    uVar100 = sVar80 * auVar12._12_2_ + sVar75;
    uVar103 = sVar82 * uVar29 + sVar77;
    uVar87 = uVar86 >> 8;
    uVar89 = uVar88 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar96 = uVar94 >> 8;
    uVar99 = uVar97 >> 8;
    uVar102 = uVar100 >> 8;
    uVar104 = uVar103 >> 8;
    uVar105 = sVar79 * (ushort)auVar1[8] + sVar64;
    uVar107 = sVar81 * (ushort)auVar1[9] + sVar66;
    uVar109 = sVar72 * (ushort)auVar1[10] + sVar67;
    uVar111 = sVar74 * (ushort)auVar1[0xb] + sVar70;
    uVar113 = sVar76 * (ushort)auVar1[0xc] + sVar71;
    uVar115 = sVar78 * (ushort)auVar1[0xd] + sVar73;
    uVar117 = sVar80 * (ushort)auVar1[0xe] + sVar75;
    uVar119 = sVar82 * (ushort)auVar1[0xf] + sVar77;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar101 = uVar119 >> 8;
    puVar55[-0x30] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    puVar55[-0x2f] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    puVar55[-0x2e] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar55[-0x2d] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar55[-0x2c] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar96);
    puVar55[-0x2b] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar99);
    puVar55[-0x2a] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar102);
    puVar55[-0x29] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar55[-0x28] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar55[-0x27] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar55[-0x26] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar55[-0x25] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar55[-0x24] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar55[-0x23] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar55[-0x22] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar55[-0x21] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar101);
    uVar86 = sVar79 * uVar59 + sVar64;
    uVar88 = sVar81 * auVar30._2_2_ + sVar66;
    uVar90 = sVar72 * auVar38._0_2_ + sVar67;
    uVar92 = sVar74 * sVar60 + sVar70;
    uVar94 = sVar76 * auVar25._8_2_ + sVar71;
    uVar97 = sVar78 * auVar17._10_2_ + sVar73;
    uVar100 = sVar80 * auVar9._12_2_ + sVar75;
    uVar103 = sVar82 * uVar83 + sVar77;
    uVar87 = uVar86 >> 8;
    uVar89 = uVar88 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar96 = uVar94 >> 8;
    uVar99 = uVar97 >> 8;
    uVar102 = uVar100 >> 8;
    uVar104 = uVar103 >> 8;
    uVar105 = sVar79 * (ushort)auVar2[8] + sVar64;
    uVar107 = sVar81 * (ushort)auVar2[9] + sVar66;
    uVar109 = sVar72 * (ushort)auVar2[10] + sVar67;
    uVar111 = sVar74 * (ushort)auVar2[0xb] + sVar70;
    uVar113 = sVar76 * (ushort)auVar2[0xc] + sVar71;
    uVar115 = sVar78 * (ushort)auVar2[0xd] + sVar73;
    uVar117 = sVar80 * (ushort)auVar2[0xe] + sVar75;
    uVar119 = sVar82 * (ushort)auVar2[0xf] + sVar77;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar101 = uVar119 >> 8;
    puVar55[-0x20] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    puVar55[-0x1f] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    puVar55[-0x1e] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar55[-0x1d] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar55[-0x1c] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar96);
    puVar55[-0x1b] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar99);
    puVar55[-0x1a] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar102);
    puVar55[-0x19] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar55[-0x18] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar55[-0x17] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar55[-0x16] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar55[-0x15] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar55[-0x14] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar55[-0x13] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar55[-0x12] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar55[-0x11] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar101);
    uVar86 = sVar79 * (ushort)auVar3[0] + sVar64;
    uVar88 = sVar81 * auVar42._0_2_ + sVar66;
    uVar90 = sVar72 * auVar41._0_2_ + sVar67;
    uVar92 = sVar74 * sVar61 + sVar70;
    uVar94 = sVar76 * auVar26._8_2_ + sVar71;
    uVar97 = sVar78 * auVar18._10_2_ + sVar73;
    uVar100 = sVar80 * auVar10._12_2_ + sVar75;
    uVar103 = sVar82 * uVar84 + sVar77;
    uVar87 = uVar86 >> 8;
    uVar89 = uVar88 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar96 = uVar94 >> 8;
    uVar99 = uVar97 >> 8;
    uVar102 = uVar100 >> 8;
    uVar104 = uVar103 >> 8;
    uVar105 = sVar79 * (ushort)auVar3[8] + sVar64;
    uVar107 = sVar81 * (ushort)auVar3[9] + sVar66;
    uVar109 = sVar72 * (ushort)auVar3[10] + sVar67;
    uVar111 = sVar74 * (ushort)auVar3[0xb] + sVar70;
    uVar113 = sVar76 * (ushort)auVar3[0xc] + sVar71;
    uVar115 = sVar78 * (ushort)auVar3[0xd] + sVar73;
    uVar117 = sVar80 * (ushort)auVar3[0xe] + sVar75;
    uVar119 = sVar82 * (ushort)auVar3[0xf] + sVar77;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar101 = uVar119 >> 8;
    puVar55[-0x10] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    puVar55[-0xf] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    puVar55[-0xe] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar55[-0xd] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar55[-0xc] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar96);
    puVar55[-0xb] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar99);
    puVar55[-10] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar102);
    puVar55[-9] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar55[-8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar55[-7] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar55[-6] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar55[-5] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar55[-4] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar55[-3] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar55[-2] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar55[-1] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar101);
    uVar105 = sVar79 * uVar62 + sVar64;
    uVar107 = sVar81 * auVar31._2_2_ + sVar66;
    uVar109 = sVar72 * auVar45._0_2_ + sVar67;
    uVar111 = sVar74 * sVar63 + sVar70;
    uVar113 = sVar76 * auVar27._8_2_ + sVar71;
    uVar115 = sVar78 * auVar19._10_2_ + sVar73;
    uVar117 = sVar80 * auVar11._12_2_ + sVar75;
    uVar119 = sVar82 * uVar85 + sVar77;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar101 = uVar119 >> 8;
    uVar86 = sVar79 * (ushort)auVar4[8] + sVar64;
    uVar88 = sVar81 * (ushort)auVar4[9] + sVar66;
    uVar90 = sVar72 * (ushort)auVar4[10] + sVar67;
    uVar92 = sVar74 * (ushort)auVar4[0xb] + sVar70;
    uVar94 = sVar76 * (ushort)auVar4[0xc] + sVar71;
    uVar97 = sVar78 * (ushort)auVar4[0xd] + sVar73;
    uVar100 = sVar80 * (ushort)auVar4[0xe] + sVar75;
    uVar103 = sVar82 * (ushort)auVar4[0xf] + sVar77;
    uVar87 = uVar86 >> 8;
    uVar89 = uVar88 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar96 = uVar94 >> 8;
    uVar99 = uVar97 >> 8;
    uVar102 = uVar100 >> 8;
    uVar104 = uVar103 >> 8;
    *puVar55 = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar55[1] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar55[2] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar55[3] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar55[4] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar55[5] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar55[6] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar55[7] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar101);
    puVar55[8] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    puVar55[9] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    puVar55[10] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar55[0xb] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar55[0xc] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar96);
    puVar55[0xd] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar99);
    puVar55[0xe] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar102);
    puVar55[0xf] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar55 = puVar55 + stride;
  } while (uVar54 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_v_predictor_64x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[15]);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top_lolo = LoadUnaligned16(top_row);
  const __m128i top_lohi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lolo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lolo, zero);
  const __m128i top3 = cvtepu8_epi16(top_lohi);
  const __m128i top4 = _mm_unpackhi_epi8(top_lohi, zero);

  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = _mm_unpackhi_epi8(weights, zero);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i top_hilo = LoadUnaligned16(top_row + 32);
  const __m128i top_hihi = LoadUnaligned16(top_row + 48);
  const __m128i top5 = cvtepu8_epi16(top_hilo);
  const __m128i top6 = _mm_unpackhi_epi8(top_hilo, zero);
  const __m128i top7 = cvtepu8_epi16(top_hihi);
  const __m128i top8 = _mm_unpackhi_epi8(top_hihi, zero);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}